

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
 __thiscall
mp::BasicExprFactory<std::allocator<char>>::
BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>> *this,Kind kind,int num_args)

{
  SafeInt<int> extra_bytes;
  AssertionFailure *this_00;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  BVar1;
  
  if (-1 < num_args) {
    extra_bytes = operator*((SafeInt<int>)0x8,num_args + -1);
    BVar1.impl_ = Allocate<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                            (this,kind,extra_bytes.value_);
    (BVar1.impl_)->num_args = num_args;
    BVar1._8_8_ = 0;
    return BVar1;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid number of arguments");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BasicIteratedExprBuilder<ExprType> BeginIterated(
        expr::Kind kind, int num_args) {
    MP_ASSERT(num_args >= 0, "invalid number of arguments");
    SafeInt<int> size = sizeof(Expr::Impl*);
    typename ExprType::Impl *impl =
        Allocate<ExprType>(kind, val(size * (num_args - 1)));
    impl->num_args = num_args;
    return BasicIteratedExprBuilder<ExprType>(impl);
  }